

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O2

bool double_conversion::isWhitespace(int x)

{
  char *pcVar1;
  ushort *puVar2;
  bool bVar3;
  int i;
  long lVar4;
  
  lVar4 = 0;
  if (x < 0x80) {
    do {
      bVar3 = lVar4 != 6;
      if (lVar4 == 6) {
        return bVar3;
      }
      pcVar1 = &kWhitespaceTable7 + lVar4;
      lVar4 = lVar4 + 1;
    } while (*pcVar1 != x);
  }
  else {
    do {
      bVar3 = lVar4 != 0x28;
      if (lVar4 == 0x28) {
        return bVar3;
      }
      puVar2 = (ushort *)((long)&kWhitespaceTable16 + lVar4);
      lVar4 = lVar4 + 2;
    } while ((uint)*puVar2 != x);
  }
  return bVar3;
}

Assistant:

static bool isWhitespace(int x) {
  if (x < 128) {
    for (int i = 0; i < kWhitespaceTable7Length; i++) {
      if (kWhitespaceTable7[i] == x) return true;
    }
  } else {
    for (int i = 0; i < kWhitespaceTable16Length; i++) {
      if (kWhitespaceTable16[i] == x) return true;
    }
  }
  return false;
}